

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O3

ssize_t __thiscall
Fl_Preferences::RootNode::read(RootNode *this,int __fd,void *__buf,size_t __nbytes)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  Node *this_00;
  char *pcVar3;
  char buf [1024];
  char local_438 [1032];
  
  if ((this->filename_ != (char *)0x0) &&
     (__stream = (FILE *)fl_fopen(this->filename_,"rb"), __stream != (FILE *)0x0)) {
    fgets(local_438,0x400,__stream);
    fgets(local_438,0x400,__stream);
    fgets(local_438,0x400,__stream);
    this_00 = this->prefs_->node;
    pcVar1 = fgets(local_438,0x400,__stream);
    if (pcVar1 != (char *)0x0) {
      pcVar1 = local_438 + 1;
      do {
        if (local_438[0] == '+') {
          sVar2 = strcspn(pcVar1,"\n\r");
          if (sVar2 != 0) {
            local_438[sVar2 + 1] = '\0';
            Node::add(this_00,pcVar1);
          }
        }
        else if (local_438[0] == '[') {
          sVar2 = strcspn(pcVar1,"]\n\r");
          local_438[sVar2 + 1] = '\0';
          this_00 = Node::find(this->prefs_->node,pcVar1);
        }
        else {
          sVar2 = strcspn(local_438,"\n\r");
          if (sVar2 != 0) {
            local_438[sVar2] = '\0';
            Node::set(this_00,local_438);
          }
        }
        pcVar3 = fgets(local_438,0x400,__stream);
      } while (pcVar3 != (char *)0x0);
    }
    fclose(__stream);
    return 0;
  }
  return 0xffffffff;
}

Assistant:

int Fl_Preferences::RootNode::read() {
  if (!filename_)   // RUNTIME preferences
    return -1; 
  char buf[1024];
  FILE *f = fl_fopen( filename_, "rb" );
  if ( !f )
    return -1; 
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  Node *nd = prefs_->node;
  for (;;) {
    if ( !fgets( buf, 1024, f ) ) break;	// EOF or Error
    if ( buf[0]=='[' ) {			// read a new group
      size_t end = strcspn( buf+1, "]\n\r" );
      buf[ end+1 ] = 0;
      nd = prefs_->node->find( buf+1 );
    } else if ( buf[0]=='+' ) {			// value of previous name/value pair spans multiple lines
      size_t end = strcspn( buf+1, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end+1 ] = 0;
	nd->add( buf+1 );
      }
    } else {					 // read a name/value pair
      size_t end = strcspn( buf, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end ] = 0;
	nd->set( buf );
      }
    }
  }
  fclose( f );
  return 0;
}